

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_bwt_n.hpp
# Opt level: O0

void __thiscall
dna_bwt_n<dna_string_n>::dna_bwt_n(dna_bwt_n<dna_string_n> *this,string *path,char TERM)

{
  char cVar1;
  streamoff sVar2;
  char in_DL;
  string *in_RSI;
  char *in_RDI;
  uint64_t i;
  uint64_t n_term;
  string *in_stack_00000120;
  char in_stack_00000287;
  string *in_stack_00000288;
  dna_string_n *in_stack_00000290;
  undefined4 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeec;
  undefined1 in_stack_fffffffffffffeed;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  dna_string_n *in_stack_fffffffffffffef0;
  dna_string_n *this_00;
  ulong local_e8;
  string local_d8 [144];
  string local_48 [32];
  fpos local_28 [23];
  char local_11;
  
  *in_RDI = '#';
  in_RDI[8] = '\0';
  in_RDI[9] = '\0';
  in_RDI[10] = '\0';
  in_RDI[0xb] = '\0';
  in_RDI[0xc] = '\0';
  in_RDI[0xd] = '\0';
  in_RDI[0xe] = '\0';
  in_RDI[0xf] = '\0';
  in_RDI[0x10] = '\0';
  in_RDI[0x11] = '\0';
  in_RDI[0x12] = '\0';
  in_RDI[0x13] = '\0';
  in_RDI[0x14] = '\0';
  in_RDI[0x15] = '\0';
  in_RDI[0x16] = '\0';
  in_RDI[0x17] = '\0';
  in_RDI[0x18] = '\0';
  in_RDI[0x19] = '\0';
  in_RDI[0x1a] = '\0';
  in_RDI[0x1b] = '\0';
  in_RDI[0x1c] = '\0';
  in_RDI[0x1d] = '\0';
  in_RDI[0x1e] = '\0';
  in_RDI[0x1f] = '\0';
  in_RDI[0x20] = '\0';
  in_RDI[0x21] = '\0';
  in_RDI[0x22] = '\0';
  in_RDI[0x23] = '\0';
  in_RDI[0x24] = '\0';
  in_RDI[0x25] = '\0';
  in_RDI[0x26] = '\0';
  in_RDI[0x27] = '\0';
  in_RDI[0x28] = '\0';
  in_RDI[0x29] = '\0';
  in_RDI[0x2a] = '\0';
  in_RDI[0x2b] = '\0';
  in_RDI[0x2c] = '\0';
  in_RDI[0x2d] = '\0';
  in_RDI[0x2e] = '\0';
  in_RDI[0x2f] = '\0';
  in_RDI[0x30] = '\0';
  in_RDI[0x31] = '\0';
  in_RDI[0x32] = '\0';
  in_RDI[0x33] = '\0';
  in_RDI[0x34] = '\0';
  in_RDI[0x35] = '\0';
  in_RDI[0x36] = '\0';
  in_RDI[0x37] = '\0';
  local_11 = in_DL;
  dna_string_n::dna_string_n(in_stack_fffffffffffffef0);
  *in_RDI = local_11;
  std::__cxx11::string::string(local_48,in_RSI);
  local_28._0_16_ = filesize(in_stack_00000120);
  this_00 = local_28._8_8_;
  sVar2 = std::fpos::operator_cast_to_long(local_28);
  *(streamoff *)(in_RDI + 8) = sVar2;
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string(local_d8,in_RSI);
  dna_string_n::dna_string_n(in_stack_00000290,in_stack_00000288,in_stack_00000287);
  dna_string_n::operator=
            (this_00,(dna_string_n *)
                     CONCAT17(in_stack_fffffffffffffeef,
                              CONCAT16(in_stack_fffffffffffffeee,
                                       CONCAT15(in_stack_fffffffffffffeed,
                                                CONCAT14(in_stack_fffffffffffffeec,
                                                         in_stack_fffffffffffffee8)))));
  dna_string_n::~dna_string_n(this_00);
  std::__cxx11::string::~string(local_d8);
  for (local_e8 = 0; local_e8 < *(ulong *)(in_RDI + 8); local_e8 = local_e8 + 1) {
    cVar1 = dna_string_n::operator[]((dna_string_n *)(in_RDI + 0x38),local_e8);
    *(ulong *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + (ulong)(cVar1 == local_11);
    cVar1 = dna_string_n::operator[]((dna_string_n *)(in_RDI + 0x38),local_e8);
    *(ulong *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + (ulong)(cVar1 == 'A');
    cVar1 = dna_string_n::operator[]((dna_string_n *)(in_RDI + 0x38),local_e8);
    *(ulong *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + (ulong)(cVar1 == 'C');
    cVar1 = dna_string_n::operator[]((dna_string_n *)(in_RDI + 0x38),local_e8);
    *(ulong *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + (ulong)(cVar1 == 'G');
    cVar1 = dna_string_n::operator[]((dna_string_n *)(in_RDI + 0x38),local_e8);
    *(ulong *)(in_RDI + 0x30) = (ulong)(cVar1 == 'N') + *(long *)(in_RDI + 0x30);
  }
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x10) + *(long *)(in_RDI + 0x18);
  *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x18) + *(long *)(in_RDI + 0x20);
  *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x20) + *(long *)(in_RDI + 0x28);
  *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x28) + *(long *)(in_RDI + 0x30);
  return;
}

Assistant:

dna_bwt_n(string path, char TERM = '#'){

		this->TERM = TERM;

		n = uint64_t(filesize(path));

		BWT = str_type(path, TERM);

		uint64_t n_term = 0;

		//build F column
		for(uint64_t i=0;i<n;++i){

			assert(BWT[i] < 256);

			F_A += (BWT[i]==TERM);
			F_C += (BWT[i]=='A');
			F_G += (BWT[i]=='C');
			F_N += (BWT[i]=='G');
			F_T += (BWT[i]=='N');

		}

		F_C += F_A;
		F_G += F_C;
		F_N += F_G;
		F_T += F_N;

	}